

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

void Abc_SclLoad(SC_Lib *pLib,SC_Lib **ppScl)

{
  if (*ppScl != (SC_Lib *)0x0) {
    Abc_SclLibFree(*ppScl);
    *ppScl = (SC_Lib *)0x0;
  }
  if (*ppScl == (SC_Lib *)0x0) {
    if (pLib != (SC_Lib *)0x0) {
      *ppScl = pLib;
    }
    return;
  }
  __assert_fail("*ppScl == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/scl.c"
                ,0x56,"void Abc_SclLoad(SC_Lib *, SC_Lib **)");
}

Assistant:

void Abc_SclLoad( SC_Lib * pLib, SC_Lib ** ppScl )
{
    if ( *ppScl )
    {
        Abc_SclLibFree( *ppScl );
        *ppScl = NULL;
    }
    assert( *ppScl == NULL );
    if ( pLib )
        *(SC_Lib **)ppScl = pLib;
}